

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O3

void __thiscall amrex::TagBoxArray::local_collate_cpu(TagBoxArray *this,PinnedVector<IntVect> *v)

{
  PinnedVector<IntVect> *pPVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  pointer pIVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  FabArray<amrex::TagBox> *this_00;
  bool bVar13;
  Vector<int,_std::allocator<int>_> count;
  Vector<int,_std::allocator<int>_> offset;
  MFIter fai;
  Box local_12c;
  vector<int,_std::allocator<int>_> local_110;
  PinnedVector<IntVect> *local_f8;
  FabArray<amrex::TagBox> *local_f0;
  vector<int,_std::allocator<int>_> local_e8;
  MFIter local_d0;
  Array4<const_char> local_70;
  
  iVar5 = (int)((ulong)((long)*(pointer *)
                               ((long)&(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.
                                       indexArray.super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + 8) -
                       (long)(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.indexArray.
                             super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  if (iVar5 != 0) {
    local_f8 = v;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_110,(long)iVar5,(allocator_type *)&local_d0);
    MFIter::MFIter(&local_d0,(FabArrayBase *)this,'\0');
    local_f0 = &this->super_FabArray<amrex::TagBox>;
    if (local_d0.currentIndex < local_d0.endIndex) {
      do {
        FabArray<amrex::TagBox>::const_array<amrex::TagBox,_0>(&local_70,local_f0,&local_d0);
        FabArrayBase::fabbox
                  (&local_12c,local_d0.fabArray,
                   ((local_d0.index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[local_d0.currentIndex]);
        lVar2 = (long)local_12c.smallend.vect[2];
        iVar5 = 0;
        if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
          pcVar7 = local_70.p +
                   ((((long)local_12c.smallend.vect[1] - (long)local_70.begin.y) * local_70.jstride
                     + (lVar2 - local_70.begin.z) * local_70.kstride +
                    (long)local_12c.smallend.vect[0]) - (long)local_70.begin.x);
          iVar5 = 0;
          do {
            pcVar8 = pcVar7;
            lVar12 = (long)local_12c.smallend.vect[1];
            if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
              do {
                if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                  lVar11 = 0;
                  do {
                    iVar5 = (iVar5 + 1) - (uint)(pcVar8[lVar11] == '\0');
                    lVar11 = lVar11 + 1;
                  } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                           (int)lVar11);
                }
                lVar12 = lVar12 + 1;
                pcVar8 = pcVar8 + local_70.jstride;
              } while (local_12c.bigend.vect[1] + 1 != (int)lVar12);
            }
            lVar2 = lVar2 + 1;
            pcVar7 = pcVar7 + local_70.kstride;
          } while (local_12c.bigend.vect[2] + 1 != (int)lVar2);
        }
        piVar3 = &local_d0.currentIndex;
        if (local_d0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar3 = ((local_d0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + local_d0.currentIndex;
        }
        local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[*piVar3] = iVar5;
        MFIter::operator++(&local_d0);
      } while (local_d0.currentIndex < local_d0.endIndex);
    }
    this_00 = local_f0;
    MFIter::~MFIter(&local_d0);
    local_d0.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_e8,
               ((long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) + 1,(value_type_conflict *)&local_d0,
               (allocator_type *)&local_70);
    pPVar1 = local_f8;
    if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      iVar5 = *local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = iVar5;
      piVar3 = local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
      if (piVar3 != local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        piVar4 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 2;
        do {
          iVar5 = iVar5 + *piVar3;
          *piVar4 = iVar5;
          piVar3 = piVar3 + 1;
          piVar4 = piVar4 + 1;
        } while (piVar3 != local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
    }
    PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
              (local_f8,(long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish[-1]);
    if (pPVar1->m_size != 0) {
      MFIter::MFIter(&local_d0,&this_00->super_FabArrayBase,'\0');
      if (local_d0.currentIndex < local_d0.endIndex) {
        do {
          iVar5 = local_d0.currentIndex;
          if (local_d0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            iVar5 = ((local_d0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[local_d0.currentIndex];
          }
          if (0 < local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar5]) {
            pIVar9 = local_f8->m_data;
            iVar5 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar5];
            FabArray<amrex::TagBox>::const_array<amrex::TagBox,_0>(&local_70,this_00,&local_d0);
            FabArrayBase::fabbox
                      (&local_12c,local_d0.fabArray,
                       ((local_d0.index_map)->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[local_d0.currentIndex]);
            this_00 = local_f0;
            if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
              pIVar9 = pIVar9 + iVar5;
              iVar5 = local_12c.smallend.vect[2];
              do {
                iVar10 = local_12c.smallend.vect[1];
                if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                  do {
                    iVar6 = local_12c.smallend.vect[0];
                    if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                      do {
                        if (local_70.p
                            [((long)iVar5 - (long)local_70.begin.z) * local_70.kstride +
                             (long)(iVar6 - local_70.begin.x) +
                             ((long)iVar10 - (long)local_70.begin.y) * local_70.jstride] != '\0') {
                          pIVar9->vect[0] = iVar6;
                          pIVar9->vect[1] = iVar10;
                          pIVar9->vect[2] = iVar5;
                          pIVar9 = pIVar9 + 1;
                        }
                        iVar6 = iVar6 + 1;
                      } while (local_12c.bigend.vect[0] + 1 != iVar6);
                    }
                    bVar13 = iVar10 != local_12c.bigend.vect[1];
                    iVar10 = iVar10 + 1;
                  } while (bVar13);
                }
                bVar13 = iVar5 != local_12c.bigend.vect[2];
                iVar5 = iVar5 + 1;
              } while (bVar13);
            }
          }
          MFIter::operator++(&local_d0);
        } while (local_d0.currentIndex < local_d0.endIndex);
      }
      MFIter::~MFIter(&local_d0);
    }
    if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
TagBoxArray::local_collate_cpu (Gpu::PinnedVector<IntVect>& v) const
{
    if (this->local_size() == 0) return;

    Vector<int> count(this->local_size());
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter fai(*this); fai.isValid(); ++fai)
    {
        Array4<char const> const& arr = this->const_array(fai);
        Box const& bx = fai.fabbox();
        int c = 0;
        AMREX_LOOP_3D(bx,i,j,k,
        {
            if (arr(i,j,k) != TagBox::CLEAR) ++c;
        });
        count[fai.LocalIndex()] = c;
    }

    Vector<int> offset(count.size()+1, 0);
    std::partial_sum(count.begin(), count.end(), offset.begin()+1);

    v.resize(offset.back());

    if (v.empty()) return;

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter fai(*this); fai.isValid(); ++fai)
    {
        int li = fai.LocalIndex();
        if (count[li] > 0) {
            IntVect* p = v.data() + offset[li];
            Array4<char const> const& arr = this->const_array(fai);
            Box const& bx = fai.fabbox();
            AMREX_LOOP_3D(bx,i,j,k,
            {
                if (arr(i,j,k) != TagBox::CLEAR) {
                    *p++ = IntVect(AMREX_D_DECL(i,j,k));
                }
            });
        }
    }
}